

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAV.h
# Opt level: O0

double __thiscall
QAV<MonahanPOMDPPlanner>::GetQ(QAV<MonahanPOMDPPlanner> *this,Index jaohI,Index jaI)

{
  MonahanPlanner *this_00;
  long *in_RDI;
  double dVar1;
  LIndex unaff_retaddr;
  PlanningUnitMADPDiscrete *in_stack_00000008;
  double q;
  JointBeliefInterface *jb;
  Index t;
  LIndex in_stack_00000060;
  PlanningUnitMADPDiscrete *in_stack_00000068;
  undefined8 in_stack_ffffffffffffffd0;
  JointBeliefInterface *in_stack_ffffffffffffffd8;
  
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
            ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  PlanningUnitMADPDiscrete::GetTimeStepForJAOHI(in_stack_00000008,unaff_retaddr);
  (**(code **)(*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x88)) + 0x60))
            ((long)in_RDI + *(long *)(*in_RDI + -0x88));
  this_00 = (MonahanPlanner *)
            PlanningUnitMADPDiscrete::GetJointBeliefInterface(in_stack_00000068,in_stack_00000060);
  dVar1 = MonahanPlanner::GetQ
                    (this_00,in_stack_ffffffffffffffd8,
                     (Index)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                     (Index)in_stack_ffffffffffffffd0);
  if (this_00 != (MonahanPlanner *)0x0) {
    (*(this_00->super_AlphaVectorPlanning).super_TimedAlgorithm._vptr_TimedAlgorithm[1])();
  }
  return dVar1;
}

Assistant:

double GetQ(Index jaohI, Index jaI) const
        {
            Index t = GetPU()->GetTimeStepForJAOHI(jaohI);
            //Index t = GetPU()->GetJointActionObservationHistoryTree(jaohI)->
            //GetJointActionObservationHistory()->GetLength();
            JointBeliefInterface * jb = GetPU()->GetJointBeliefInterface(jaohI);
            double q = _m_p->GetQ (*jb, t, jaI);
            delete jb;
            return( q );
        }